

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O3

double __thiscall NimState::get_result(NimState *this,int current_player_to_move)

{
  double dVar1;
  
  if (this->chips == 0) {
    check_invariant(this);
    if (this->player_to_move == current_player_to_move) {
      dVar1 = 1.0;
    }
    else {
      dVar1 = 0.0;
    }
    return dVar1;
  }
  MCTS::assertion_failed
            ("chips == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/nim.h"
             ,0x40);
}

Assistant:

double get_result(int current_player_to_move) const
	{
		attest(chips == 0);
		check_invariant();

		if (player_to_move == current_player_to_move) {
			return 1.0;
		}
		else {
			return 0.0;
		}
	}